

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg_Data.h
# Opt level: O2

bool __thiscall Nova::Arg_Data::Parse_Value(Arg_Data *this,int argc,char **argv,int *current_arg)

{
  int iVar1;
  double *pdVar2;
  int i;
  double dVar3;
  
  switch(this->type) {
  case OPTION:
    this->boolean_value = true;
    iVar1 = *current_arg + 1;
    break;
  case INTEGER:
    if (argc <= *current_arg + 1) {
      return false;
    }
    iVar1 = atoi(argv[(long)*current_arg + 1]);
    this->integer_value = iVar1;
    goto LAB_001304d0;
  case DOUBLE:
    iVar1 = *current_arg;
    if (argc <= iVar1 + 1) {
      return false;
    }
    dVar3 = atof(argv[(long)iVar1 + 1]);
    this->double_value = dVar3;
    iVar1 = iVar1 + 2;
    break;
  case VECTOR2:
    iVar1 = 0;
    if (argc <= *current_arg + 2) {
      return false;
    }
    for (; iVar1 != 2; iVar1 = iVar1 + 1) {
      dVar3 = atof(argv[(long)(*current_arg + iVar1) + 1]);
      pdVar2 = Vector<double,_2,_true>::operator[](&this->vector_2d_value,iVar1);
      *pdVar2 = dVar3;
    }
    iVar1 = *current_arg + 3;
    break;
  case VECTOR3:
    iVar1 = 0;
    if (argc <= *current_arg + 3) {
      return false;
    }
    for (; iVar1 != 3; iVar1 = iVar1 + 1) {
      dVar3 = atof(argv[(long)(*current_arg + iVar1) + 1]);
      pdVar2 = Vector<double,_3,_true>::operator[](&this->vector_3d_value,iVar1);
      *pdVar2 = dVar3;
    }
    iVar1 = *current_arg + 4;
    break;
  case STRING:
    if (argc <= *current_arg + 1) {
      return false;
    }
    std::__cxx11::string::assign((char *)&this->string_value);
LAB_001304d0:
    iVar1 = *current_arg + 2;
    break;
  default:
    return false;
  }
  *current_arg = iVar1;
  return true;
}

Assistant:

bool Parse_Value(int argc,char* argv[],int& current_arg)
    {
        switch(type)
        {
            case OPTION:    boolean_value=true;
                            current_arg++;
                            return true;

            case INTEGER:   if(current_arg+1<argc)
                            {
                                integer_value=atoi(argv[current_arg+1]);
                                current_arg+=2;
                                return true;
                            }
                            else return false;

            case DOUBLE:    if(current_arg+1<argc)
                            {
                                double_value=atof(argv[current_arg+1]);
                                current_arg+=2;
                                return true;
                            }
                            else return false;

            case VECTOR2:   if(current_arg+2<argc)
                            {
                                for(int i=0;i<=1;i++) vector_2d_value[i]=atof(argv[current_arg+i+1]);
                                current_arg+=3;
                                return true;
                            }
                            else return false;

            case VECTOR3:   if(current_arg+3<argc)
                            {
                                for(int i=0;i<=2;i++) vector_3d_value[i]=atof(argv[current_arg+i+1]);
                                current_arg+=4;
                                return true;
                            }
                            else return false;

            case STRING:    if(current_arg+1<argc)
                            {
                                string_value=argv[current_arg+1];
                                current_arg+=2;
                                return true;
                            }
                            else return false;

            default:        return false;
        }

        return false;
    }